

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::CharSet<char16_t>::IsSubsetOf(CharSet<char16_t> *this,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  ulong uVar9;
  uint index;
  bool bVar10;
  
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    index = 0;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (4 < (this->rep).compact.countPlusOne - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      bVar4 = *(int *)&this->rep - 1U <= index;
      if (bVar4) {
        return bVar4;
      }
      uVar5 = GetCompactCharU(this,index);
      if ((other->rep).compact.countPlusOne - 1 < 5) {
        uVar6 = uVar5 & 0xffff;
        if ((((other->rep).compact.cs[0] != uVar6) && ((other->rep).compact.cs[1] != uVar6)) &&
           ((other->rep).compact.cs[2] != uVar6)) {
          bVar10 = (other->rep).compact.cs[3] == uVar6;
          goto LAB_00e70bc5;
        }
      }
      else {
        if ((uVar5 & 0xff00) == 0) {
          bVar10 = (*(uint *)((long)&other->rep + (ulong)((uVar5 & 0xffff) >> 5) * 4 + 8) >>
                    (uVar5 & 0x1f) & 1) != 0;
        }
        else {
          if ((other->rep).compact.countPlusOne == 0) {
            return bVar4;
          }
          bVar10 = Get_helper(other,uVar5 & 0xffff);
        }
LAB_00e70bc5:
        if (bVar10 == false) {
          return bVar4;
        }
      }
      index = index + 1;
    } while( true );
  }
  if ((4 < (other->rep).compact.countPlusOne - 1) &&
     (((this->rep).compact.cs[0] & ~(other->rep).compact.cs[0]) == 0)) {
    uVar3 = 0;
    do {
      uVar9 = uVar3;
      if (uVar9 == 7) break;
      uVar3 = uVar9 + 1;
    } while ((*(uint *)((long)&this->rep + uVar9 * 4 + 0xc) &
             ~*(uint *)((long)&other->rep + uVar9 * 4 + 0xc)) == 0);
    if (6 < uVar9) {
      pCVar1 = (this->rep).full.root;
      if (pCVar1 == (CharSetNode *)0x0) {
        return true;
      }
      if ((other->rep).compact.countPlusOne != 0) {
        iVar7 = (*pCVar1->_vptr_CharSetNode[9])(pCVar1,2);
        return SUB41(iVar7,0);
      }
    }
  }
  return false;
}

Assistant:

bool CharSet<char16>::IsSubsetOf(const CharSet<Char>& other) const
    {
        if (IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                if (!other.Get(this->GetCompactChar(i)))
                    return false;
            }
            return true;
        }
        else
        {
            if (other.IsCompact())
                return false;
            if (!rep.full.direct.IsSubsetOf(other.rep.full.direct))
                return false;
            if (rep.full.root == nullptr)
                return true;
            if (other.rep.full.root == nullptr)
                return false;
            return rep.full.root->IsSubsetOf(CharSetNode::levels - 1, other.rep.full.root);
        }
    }